

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O0

void uss_open(SftpServer *srv,SftpReplyBuilder *reply,ptrlen path,uint flags,fxp_attrs attrs)

{
  int fd_00;
  char *__file;
  unsigned_long local_70;
  int fd;
  char *pathstr;
  int openflags;
  UnixSftpServer *uss;
  uint flags_local;
  SftpReplyBuilder *reply_local;
  SftpServer *srv_local;
  ptrlen path_local;
  
  if (((flags ^ 0xffffffff) & 3) == 0) {
    pathstr._4_4_ = 2;
  }
  else if ((flags & 2) == 0) {
    pathstr._4_4_ = 0;
  }
  else {
    pathstr._4_4_ = 1;
  }
  if ((flags & 4) != 0) {
    pathstr._4_4_ = pathstr._4_4_ | 0x400;
  }
  if ((flags & 8) != 0) {
    pathstr._4_4_ = pathstr._4_4_ | 0x40;
  }
  if ((flags & 0x10) != 0) {
    pathstr._4_4_ = pathstr._4_4_ | 0x200;
  }
  if ((flags & 0x20) != 0) {
    pathstr._4_4_ = pathstr._4_4_ | 0x80;
  }
  __file = mkstr(path);
  if (((undefined1  [56])attrs & (undefined1  [56])0x4) == (undefined1  [56])0x0) {
    local_70 = 0x1ff;
  }
  else {
    local_70 = attrs.permissions;
  }
  fd_00 = open(__file,pathstr._4_4_,local_70);
  free(__file);
  if (fd_00 < 0) {
    uss_error((UnixSftpServer *)(srv + -6),reply);
  }
  else {
    uss_return_new_handle((UnixSftpServer *)(srv + -6),reply,fd_00);
  }
  return;
}

Assistant:

static void uss_open(SftpServer *srv, SftpReplyBuilder *reply,
                     ptrlen path, unsigned flags, struct fxp_attrs attrs)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);

    int openflags = 0;
    if (!((SSH_FXF_READ | SSH_FXF_WRITE) &~ flags))
        openflags |= O_RDWR;
    else if (flags & SSH_FXF_WRITE)
        openflags |= O_WRONLY;
    else if (flags & SSH_FXF_READ)
        openflags |= O_RDONLY;
    if (flags & SSH_FXF_APPEND)
        openflags |= O_APPEND;
    if (flags & SSH_FXF_CREAT)
        openflags |= O_CREAT;
    if (flags & SSH_FXF_TRUNC)
        openflags |= O_TRUNC;
    if (flags & SSH_FXF_EXCL)
        openflags |= O_EXCL;

    char *pathstr = mkstr(path);
    int fd = open(pathstr, openflags, GET_PERMISSIONS(attrs, 0777));
    free(pathstr);

    if (fd < 0) {
        uss_error(uss, reply);
    } else {
        uss_return_new_handle(uss, reply, fd);
    }
}